

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall svg::Document::writeToStream(Document *this,ostream *str)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_329;
  string local_328;
  string local_308;
  reference local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *body_node_str;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  ostream *local_18;
  ostream *str_local;
  Document *this_local;
  
  local_18 = str;
  str_local = (ostream *)this;
  poVar2 = std::operator<<(str,"<?xml ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"version",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"",&local_91);
  attribute<char[4]>(&local_38,&local_58,(char (*) [4])"1.0",&local_90);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"standalone",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"",&local_101);
  attribute<char[3]>(&local_b8,&local_d8,(char (*) [3])"no",&local_100);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  poVar2 = std::operator<<(poVar2,"?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ");
  poVar2 = std::operator<<(poVar2,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"width",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"px",&local_171);
  attribute<double>(&local_128,&local_148,(double *)&this->layout,&local_170);
  poVar2 = std::operator<<(poVar2,(string *)&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"height",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"px",&local_1e1);
  attribute<double>(&local_198,&local_1b8,&(this->layout).dimensions.height,&local_1e0);
  poVar2 = std::operator<<(poVar2,(string *)&local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"xmlns",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"",&local_251);
  attribute<char[27]>(&local_208,&local_228,(char (*) [27])"http://www.w3.org/2000/svg",&local_250);
  poVar2 = std::operator<<(poVar2,(string *)&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"version",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"",(allocator *)((long)&__range2 + 7));
  attribute<char[4]>(&local_278,&local_298,(char (*) [4])"1.1",&local_2c0);
  poVar2 = std::operator<<(poVar2,(string *)&local_278);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  __end2 = CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->body_nodes_str_list);
  body_node_str =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->body_nodes_str_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&body_node_str);
    poVar2 = local_18;
    if (!bVar1) break;
    local_2e8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
    std::operator<<(local_18,(string *)local_2e8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"svg",&local_329);
  elemEnd(&local_308,&local_328);
  std::operator<<(poVar2,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  return;
}

Assistant:

void writeToStream(std::ostream& str) const
        {
            str << "<?xml " << attribute("version", "1.0") << attribute("standalone", "no")
                << "?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
                << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg "
                << attribute("width", layout.dimensions.width, "px")
                << attribute("height", layout.dimensions.height, "px")
                << attribute("xmlns", "http://www.w3.org/2000/svg")
                << attribute("version", "1.1") << ">\n";
            for (const auto& body_node_str : body_nodes_str_list) {
                str << body_node_str;
            }
            str << elemEnd("svg");
        }